

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRLoader.cpp
# Opt level: O3

void __thiscall
Assimp::IRRImporter::BuildSkybox
          (IRRImporter *this,vector<aiMesh_*,_std::allocator<aiMesh_*>_> *meshes,
          vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *materials)

{
  iterator iVar1;
  IRRImporter *this_00;
  int iVar2;
  IRRImporter *this_01;
  uint i;
  long lVar3;
  int shading;
  aiString s;
  aiMesh *local_4d8;
  IRRImporter *local_4d0;
  SkyboxVertex local_4c8;
  SkyboxVertex local_498;
  SkyboxVertex local_468;
  undefined1 local_438 [20];
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_418;
  
  lVar3 = 0;
  local_4d0 = (IRRImporter *)meshes;
  do {
    this_01 = (IRRImporter *)
              (materials->super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl.
              super__Vector_impl_data._M_finish[lVar3 + -6];
    local_438._0_8_ = local_438._0_8_ & 0xffffff0000000000;
    memset(local_438 + 5,0x1b,0x3ff);
    iVar2 = snprintf(local_438 + 4,0x400,"SkyboxSide_%u");
    local_438._0_4_ = iVar2;
    aiMaterial::AddProperty((aiMaterial *)this_01,(aiString *)local_438,"?mat.name",0,0);
    local_4c8.position.x = 1.26117e-44;
    aiMaterial::AddBinaryProperty
              ((aiMaterial *)this_01,&local_4c8,4,"$mat.shadingm",0,0,aiPTI_Integer);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  local_438._0_4_ = 0xc1200000;
  local_438[4] = '\0';
  local_438[5] = '\0';
  local_438[6] = ' ';
  local_438[7] = -0x3f;
  local_438[8] = '\0';
  local_438[9] = '\0';
  local_438[10] = ' ';
  local_438[0xb] = -0x3f;
  local_438[0xc] = '\0';
  local_438[0xd] = '\0';
  local_438[0xe] = '\0';
  local_438[0xf] = '\0';
  local_438._16_4_ = 0.0;
  fStack_424 = 1.0;
  fStack_420 = 1.0;
  fStack_41c = 1.0;
  local_418 = 0.0;
  local_4c8.position.x = 10.0;
  local_4c8.position.y = -10.0;
  local_4c8.position.z = -10.0;
  local_4c8.normal.x = 0.0;
  local_4c8.normal.y = 0.0;
  local_4c8.normal.z = 1.0;
  local_4c8.uv.x = 0.0;
  local_4c8.uv.y = 1.0;
  local_4c8.uv.z = 0.0;
  local_468.position.x = 10.0;
  local_468.position.y = 10.0;
  local_468.position.z = -10.0;
  local_468.normal.x = 0.0;
  local_468.normal.y = 0.0;
  local_468.normal.z = 1.0;
  local_468.uv.x = 0.0;
  local_468.uv.y = 0.0;
  local_468.uv.z = 0.0;
  local_498.position.x = -10.0;
  local_498.position.y = 10.0;
  local_498.position.z = -10.0;
  local_498.normal.x = 0.0;
  local_498.normal.y = 0.0;
  local_498.normal.z = 1.0;
  local_498.uv.x = 1.0;
  local_498.uv.y = 0.0;
  local_498.uv.z = 0.0;
  local_4d8 = BuildSingleQuadMesh(this_01,(SkyboxVertex *)local_438,&local_4c8,&local_468,&local_498
                                 );
  this_00 = local_4d0;
  iVar1._M_current = *(aiMesh ***)&(local_4d0->super_BaseImporter).importerUnits._M_t._M_impl;
  if (iVar1._M_current ==
      *(aiMesh ***)
       &(local_4d0->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header)
  {
    this_01 = local_4d0;
    std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*>
              ((vector<aiMesh*,std::allocator<aiMesh*>> *)local_4d0,iVar1,&local_4d8);
    lVar3 = *(long *)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl;
  }
  else {
    *iVar1._M_current = local_4d8;
    lVar3 = *(long *)&(local_4d0->super_BaseImporter).importerUnits._M_t._M_impl + 8;
    *(long *)&(local_4d0->super_BaseImporter).importerUnits._M_t._M_impl = lVar3;
  }
  *(int *)(*(long *)(lVar3 + -8) + 0xe8) =
       (int)((ulong)((long)(materials->
                           super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(materials->
                          super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl.
                          super__Vector_impl_data._M_start) >> 3) + -6;
  local_438._0_4_ = 0x41200000;
  local_438[4] = '\0';
  local_438[5] = '\0';
  local_438[6] = ' ';
  local_438[7] = -0x3f;
  local_438[8] = '\0';
  local_438[9] = '\0';
  local_438[10] = ' ';
  local_438[0xb] = -0x3f;
  local_438[0xc] = '\0';
  local_438[0xd] = '\0';
  local_438[0xe] = -0x80;
  local_438[0xf] = -0x41;
  local_438._16_4_ = 0.0;
  fStack_424 = 0.0;
  fStack_420 = 1.0;
  fStack_41c = 1.0;
  local_418 = 0.0;
  local_4c8.position.x = 10.0;
  local_4c8.position.y = -10.0;
  local_4c8.position.z = 10.0;
  local_4c8.normal.x = -1.0;
  local_4c8.normal.y = 0.0;
  local_4c8.normal.z = 0.0;
  local_4c8.uv.x = 0.0;
  local_4c8.uv.y = 1.0;
  local_4c8.uv.z = 0.0;
  local_468.position.x = 10.0;
  local_468.position.y = 10.0;
  local_468.position.z = 10.0;
  local_468.normal.x = -1.0;
  local_468.normal.y = 0.0;
  local_468.normal.z = 0.0;
  local_468.uv.x = 0.0;
  local_468.uv.y = 0.0;
  local_468.uv.z = 0.0;
  local_498.position.x = 10.0;
  local_498.position.y = 10.0;
  local_498.position.z = -10.0;
  local_498.normal.x = -1.0;
  local_498.normal.y = 0.0;
  local_498.normal.z = 0.0;
  local_498.uv.x = 1.0;
  local_498.uv.y = 0.0;
  local_498.uv.z = 0.0;
  local_4d8 = BuildSingleQuadMesh(this_01,(SkyboxVertex *)local_438,&local_4c8,&local_468,&local_498
                                 );
  iVar1._M_current = *(aiMesh ***)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl;
  if (iVar1._M_current ==
      *(aiMesh ***)
       &(this_00->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header) {
    this_01 = this_00;
    std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*>
              ((vector<aiMesh*,std::allocator<aiMesh*>> *)this_00,iVar1,&local_4d8);
    lVar3 = *(long *)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl;
  }
  else {
    *iVar1._M_current = local_4d8;
    lVar3 = *(long *)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl + 8;
    *(long *)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl = lVar3;
  }
  *(int *)(*(long *)(lVar3 + -8) + 0xe8) =
       (int)((ulong)((long)(materials->
                           super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(materials->
                          super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl.
                          super__Vector_impl_data._M_start) >> 3) + -5;
  local_438._0_4_ = 0x41200000;
  local_438[4] = '\0';
  local_438[5] = '\0';
  local_438[6] = ' ';
  local_438[7] = -0x3f;
  local_438[8] = '\0';
  local_438[9] = '\0';
  local_438[10] = ' ';
  local_438[0xb] = 'A';
  local_438[0xc] = '\0';
  local_438[0xd] = '\0';
  local_438[0xe] = '\0';
  local_438[0xf] = '\0';
  local_438._16_4_ = 0.0;
  fStack_424 = -1.0;
  fStack_420 = 1.0;
  fStack_41c = 1.0;
  local_418 = 0.0;
  local_4c8.position.x = -10.0;
  local_4c8.position.y = -10.0;
  local_4c8.position.z = 10.0;
  local_4c8.normal.x = 0.0;
  local_4c8.normal.y = 0.0;
  local_4c8.normal.z = -1.0;
  local_4c8.uv.x = 0.0;
  local_4c8.uv.y = 1.0;
  local_4c8.uv.z = 0.0;
  local_468.position.x = -10.0;
  local_468.position.y = 10.0;
  local_468.position.z = 10.0;
  local_468.normal.x = 0.0;
  local_468.normal.y = 0.0;
  local_468.normal.z = -1.0;
  local_468.uv.x = 0.0;
  local_468.uv.y = 0.0;
  local_468.uv.z = 0.0;
  local_498.position.x = 10.0;
  local_498.position.y = 10.0;
  local_498.position.z = 10.0;
  local_498.normal.x = 0.0;
  local_498.normal.y = 0.0;
  local_498.normal.z = -1.0;
  local_498.uv.x = 1.0;
  local_498.uv.y = 0.0;
  local_498.uv.z = 0.0;
  local_4d8 = BuildSingleQuadMesh(this_01,(SkyboxVertex *)local_438,&local_4c8,&local_468,&local_498
                                 );
  iVar1._M_current = *(aiMesh ***)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl;
  if (iVar1._M_current ==
      *(aiMesh ***)
       &(this_00->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header) {
    this_01 = this_00;
    std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*>
              ((vector<aiMesh*,std::allocator<aiMesh*>> *)this_00,iVar1,&local_4d8);
    lVar3 = *(long *)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl;
  }
  else {
    *iVar1._M_current = local_4d8;
    lVar3 = *(long *)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl + 8;
    *(long *)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl = lVar3;
  }
  *(int *)(*(long *)(lVar3 + -8) + 0xe8) =
       (int)((ulong)((long)(materials->
                           super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(materials->
                          super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl.
                          super__Vector_impl_data._M_start) >> 3) + -4;
  local_438._0_4_ = 0xc1200000;
  local_438[4] = '\0';
  local_438[5] = '\0';
  local_438[6] = ' ';
  local_438[7] = -0x3f;
  local_438[8] = '\0';
  local_438[9] = '\0';
  local_438[10] = ' ';
  local_438[0xb] = 'A';
  local_438[0xc] = '\0';
  local_438[0xd] = '\0';
  local_438[0xe] = -0x80;
  local_438[0xf] = '?';
  local_438._16_4_ = 0.0;
  fStack_424 = 0.0;
  fStack_420 = 1.0;
  fStack_41c = 1.0;
  local_418 = 0.0;
  local_4c8.position.x = -10.0;
  local_4c8.position.y = -10.0;
  local_4c8.position.z = -10.0;
  local_4c8.normal.x = 1.0;
  local_4c8.normal.y = 0.0;
  local_4c8.normal.z = 0.0;
  local_4c8.uv.x = 0.0;
  local_4c8.uv.y = 1.0;
  local_4c8.uv.z = 0.0;
  local_468.position.x = -10.0;
  local_468.position.y = 10.0;
  local_468.position.z = -10.0;
  local_468.normal.x = 1.0;
  local_468.normal.y = 0.0;
  local_468.normal.z = 0.0;
  local_468.uv.x = 0.0;
  local_468.uv.y = 0.0;
  local_468.uv.z = 0.0;
  local_498.position.x = -10.0;
  local_498.position.y = 10.0;
  local_498.position.z = 10.0;
  local_498.normal.x = 1.0;
  local_498.normal.y = 0.0;
  local_498.normal.z = 0.0;
  local_498.uv.x = 1.0;
  local_498.uv.y = 0.0;
  local_498.uv.z = 0.0;
  local_4d8 = BuildSingleQuadMesh(this_01,(SkyboxVertex *)local_438,&local_4c8,&local_468,&local_498
                                 );
  iVar1._M_current = *(aiMesh ***)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl;
  if (iVar1._M_current ==
      *(aiMesh ***)
       &(this_00->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header) {
    this_01 = this_00;
    std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*>
              ((vector<aiMesh*,std::allocator<aiMesh*>> *)this_00,iVar1,&local_4d8);
    lVar3 = *(long *)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl;
  }
  else {
    *iVar1._M_current = local_4d8;
    lVar3 = *(long *)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl + 8;
    *(long *)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl = lVar3;
  }
  *(int *)(*(long *)(lVar3 + -8) + 0xe8) =
       (int)((ulong)((long)(materials->
                           super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(materials->
                          super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl.
                          super__Vector_impl_data._M_start) >> 3) + -3;
  local_438._0_4_ = 0x41200000;
  local_438[4] = '\0';
  local_438[5] = '\0';
  local_438[6] = ' ';
  local_438[7] = 'A';
  local_438[8] = '\0';
  local_438[9] = '\0';
  local_438[10] = ' ';
  local_438[0xb] = -0x3f;
  local_438[0xc] = '\0';
  local_438[0xd] = '\0';
  local_438[0xe] = '\0';
  local_438[0xf] = '\0';
  local_438._16_4_ = -1.0;
  fStack_424 = 0.0;
  fStack_420 = 1.0;
  fStack_41c = 1.0;
  local_418 = 0.0;
  local_4c8.position.x = 10.0;
  local_4c8.position.y = 10.0;
  local_4c8.position.z = 10.0;
  local_4c8.normal.x = 0.0;
  local_4c8.normal.y = -1.0;
  local_4c8.normal.z = 0.0;
  local_4c8.uv.x = 0.0;
  local_4c8.uv.y = 1.0;
  local_4c8.uv.z = 0.0;
  local_468.position.x = -10.0;
  local_468.position.y = 10.0;
  local_468.position.z = 10.0;
  local_468.normal.x = 0.0;
  local_468.normal.y = -1.0;
  local_468.normal.z = 0.0;
  local_468.uv.x = 0.0;
  local_468.uv.y = 0.0;
  local_468.uv.z = 0.0;
  local_498.position.x = -10.0;
  local_498.position.y = 10.0;
  local_498.position.z = -10.0;
  local_498.normal.x = 0.0;
  local_498.normal.y = -1.0;
  local_498.normal.z = 0.0;
  local_498.uv.x = 1.0;
  local_498.uv.y = 0.0;
  local_498.uv.z = 0.0;
  local_4d8 = BuildSingleQuadMesh(this_01,(SkyboxVertex *)local_438,&local_4c8,&local_468,&local_498
                                 );
  iVar1._M_current = *(aiMesh ***)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl;
  if (iVar1._M_current ==
      *(aiMesh ***)
       &(this_00->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header) {
    this_01 = this_00;
    std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*>
              ((vector<aiMesh*,std::allocator<aiMesh*>> *)this_00,iVar1,&local_4d8);
    lVar3 = *(long *)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl;
  }
  else {
    *iVar1._M_current = local_4d8;
    lVar3 = *(long *)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl + 8;
    *(long *)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl = lVar3;
  }
  *(int *)(*(long *)(lVar3 + -8) + 0xe8) =
       (int)((ulong)((long)(materials->
                           super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(materials->
                          super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl.
                          super__Vector_impl_data._M_start) >> 3) + -2;
  local_438._0_4_ = 0x41200000;
  local_438[4] = '\0';
  local_438[5] = '\0';
  local_438[6] = ' ';
  local_438[7] = -0x3f;
  local_438[8] = '\0';
  local_438[9] = '\0';
  local_438[10] = ' ';
  local_438[0xb] = 'A';
  local_438[0xc] = '\0';
  local_438[0xd] = '\0';
  local_438[0xe] = '\0';
  local_438[0xf] = '\0';
  local_438._16_4_ = 1.0;
  fStack_424 = 0.0;
  fStack_420 = 0.0;
  fStack_41c = 0.0;
  local_418 = 0.0;
  local_4c8.position.x = 10.0;
  local_4c8.position.y = -10.0;
  local_4c8.position.z = -10.0;
  local_4c8.normal.x = 0.0;
  local_4c8.normal.y = 1.0;
  local_4c8.normal.z = 0.0;
  local_4c8.uv.x = 1.0;
  local_4c8.uv.y = 0.0;
  local_4c8.uv.z = 0.0;
  local_468.position.x = -10.0;
  local_468.position.y = -10.0;
  local_468.position.z = -10.0;
  local_468.normal.x = 0.0;
  local_468.normal.y = 1.0;
  local_468.normal.z = 0.0;
  local_468.uv.x = 1.0;
  local_468.uv.y = 1.0;
  local_468.uv.z = 0.0;
  local_498.position.x = -10.0;
  local_498.position.y = -10.0;
  local_498.position.z = 10.0;
  local_498.normal.x = 0.0;
  local_498.normal.y = 1.0;
  local_498.normal.z = 0.0;
  local_498.uv.x = 0.0;
  local_498.uv.y = 1.0;
  local_498.uv.z = 0.0;
  local_4d8 = BuildSingleQuadMesh(this_01,(SkyboxVertex *)local_438,&local_4c8,&local_468,&local_498
                                 );
  iVar1._M_current = *(aiMesh ***)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl;
  if (iVar1._M_current ==
      *(aiMesh ***)
       &(this_00->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header) {
    std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*>
              ((vector<aiMesh*,std::allocator<aiMesh*>> *)this_00,iVar1,&local_4d8);
    lVar3 = *(long *)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl;
  }
  else {
    *iVar1._M_current = local_4d8;
    lVar3 = *(long *)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl + 8;
    *(long *)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl = lVar3;
  }
  *(int *)(*(long *)(lVar3 + -8) + 0xe8) =
       (int)((ulong)((long)(materials->
                           super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(materials->
                          super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl.
                          super__Vector_impl_data._M_start) >> 3) + -1;
  return;
}

Assistant:

void IRRImporter::BuildSkybox(std::vector<aiMesh*>& meshes, std::vector<aiMaterial*> materials)
{
    // Update the material of the skybox - replace the name and disable shading for skyboxes.
    for (unsigned int i = 0; i < 6;++i) {
        aiMaterial* out = ( aiMaterial* ) (*(materials.end()-(6-i)));

        aiString s;
        s.length = ::ai_snprintf( s.data, MAXLEN, "SkyboxSide_%u",i );
        out->AddProperty(&s,AI_MATKEY_NAME);

        int shading = aiShadingMode_NoShading;
        out->AddProperty(&shading,1,AI_MATKEY_SHADING_MODEL);
    }

    // Skyboxes are much more difficult. They are represented
    // by six single planes with different textures, so we'll
    // need to build six meshes.

    const ai_real l = 10.0; // the size used by Irrlicht

    // FRONT SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex(-l,-l,-l,  0, 0, 1,   1.0,1.0),
        SkyboxVertex( l,-l,-l,  0, 0, 1,   0.0,1.0),
        SkyboxVertex( l, l,-l,  0, 0, 1,   0.0,0.0),
        SkyboxVertex(-l, l,-l,  0, 0, 1,   1.0,0.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-6u);

    // LEFT SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex( l,-l,-l,  -1, 0, 0,   1.0,1.0),
        SkyboxVertex( l,-l, l,  -1, 0, 0,   0.0,1.0),
        SkyboxVertex( l, l, l,  -1, 0, 0,   0.0,0.0),
        SkyboxVertex( l, l,-l,  -1, 0, 0,   1.0,0.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-5u);

    // BACK SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex( l,-l, l,  0, 0, -1,   1.0,1.0),
        SkyboxVertex(-l,-l, l,  0, 0, -1,   0.0,1.0),
        SkyboxVertex(-l, l, l,  0, 0, -1,   0.0,0.0),
        SkyboxVertex( l, l, l,  0, 0, -1,   1.0,0.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-4u);

    // RIGHT SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex(-l,-l, l,  1, 0, 0,   1.0,1.0),
        SkyboxVertex(-l,-l,-l,  1, 0, 0,   0.0,1.0),
        SkyboxVertex(-l, l,-l,  1, 0, 0,   0.0,0.0),
        SkyboxVertex(-l, l, l,  1, 0, 0,   1.0,0.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-3u);

    // TOP SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex( l, l,-l,  0, -1, 0,   1.0,1.0),
        SkyboxVertex( l, l, l,  0, -1, 0,   0.0,1.0),
        SkyboxVertex(-l, l, l,  0, -1, 0,   0.0,0.0),
        SkyboxVertex(-l, l,-l,  0, -1, 0,   1.0,0.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-2u);

    // BOTTOM SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex( l,-l, l,  0,  1, 0,   0.0,0.0),
        SkyboxVertex( l,-l,-l,  0,  1, 0,   1.0,0.0),
        SkyboxVertex(-l,-l,-l,  0,  1, 0,   1.0,1.0),
        SkyboxVertex(-l,-l, l,  0,  1, 0,   0.0,1.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-1u);
}